

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O0

unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>
 arrow_array_stream_wrapper::anon_unknown_0::FactoryGetNext
           (uintptr_t stream_factory_ptr,ArrowStreamParameters *parameters)

{
  _func_int_ArrowArrayStream_ptr_ArrowSchema_ptr *p_Var1;
  _func_int_ArrowArrayStream_ptr_ArrowArray_ptr *p_Var2;
  _func_void_ArrowArrayStream_ptr *p_Var3;
  pointer pAVar4;
  undefined8 *in_RSI;
  unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
  in_RDI;
  ArrowArrayStream *stream;
  templated_unique_single_t *ret;
  unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>
  *in_stack_ffffffffffffffa0;
  
  duckdb::make_uniq<duckdb::ArrowArrayStreamWrapper>();
  pAVar4 = duckdb::
           unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>
           ::operator->(in_stack_ffffffffffffffa0);
  (pAVar4->arrow_array_stream).private_data = (void *)in_RSI[4];
  p_Var1 = (_func_int_ArrowArrayStream_ptr_ArrowSchema_ptr *)*in_RSI;
  p_Var2 = (_func_int_ArrowArrayStream_ptr_ArrowArray_ptr *)in_RSI[1];
  p_Var3 = (_func_void_ArrowArrayStream_ptr *)in_RSI[3];
  (pAVar4->arrow_array_stream).get_last_error = (_func_char_ptr_ArrowArrayStream_ptr *)in_RSI[2];
  (pAVar4->arrow_array_stream).release = p_Var3;
  (pAVar4->arrow_array_stream).get_schema = p_Var1;
  (pAVar4->arrow_array_stream).get_next = p_Var2;
  pAVar4 = duckdb::
           unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>
           ::operator->(in_stack_ffffffffffffffa0);
  (pAVar4->arrow_array_stream).release = EmptyStreamRelease;
  return (unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
          )(__uniq_ptr_impl<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ArrowArrayStreamWrapper_*,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
             .super__Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false>._M_head_impl;
}

Assistant:

duckdb::unique_ptr<duckdb::ArrowArrayStreamWrapper> FactoryGetNext(uintptr_t stream_factory_ptr,
                                                                   duckdb::ArrowStreamParameters &parameters) {
	auto stream = reinterpret_cast<ArrowArrayStream *>(stream_factory_ptr);
	auto ret = duckdb::make_uniq<duckdb::ArrowArrayStreamWrapper>();
	ret->arrow_array_stream = *stream;
	ret->arrow_array_stream.release = EmptyStreamRelease;
	return ret;
}